

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uchar *ttf_data;
  ImFont *pIVar2;
  ushort *puVar3;
  long lVar4;
  ushort *puVar5;
  uint uVar6;
  ImFontConfig *pIVar7;
  ulong uVar8;
  uchar *puVar9;
  uint ttf_size;
  bool bVar10;
  byte bVar11;
  ImFontConfig font_cfg;
  ImFontConfig local_b0;
  
  bVar11 = 0;
  uVar6 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar6 = *compressed_ttf_data;
  if (((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) ==
       0x57bc0000) &&
     (uVar6 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar6 >> 0x18 == 0 && (uVar6 & 0xff0000) == 0) && (uVar6 & 0xff00) == 0) &&
     (uVar6 & 0xff) == 0)) {
    uVar6 = *(uint *)((long)compressed_ttf_data + 8);
    puVar9 = ttf_data +
             (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
    puVar5 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = puVar9;
    stb__barrier_out_b = ttf_data;
    stb__dout = ttf_data;
    do {
      bVar1 = (byte)*puVar5;
      uVar6 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar5 + 3) |
                             (ulong)*(byte *)((long)puVar5 + 1) << 0x10 |
                            (ulong)(byte)puVar5[1] << 8),
                           (ushort)(puVar5[2] << 8 | puVar5[2] >> 8) + 1);
                puVar3 = puVar5 + 3;
              }
              else {
                if (uVar6 == 6) {
                  uVar8 = ~((ulong)*(byte *)((long)puVar5 + 3) |
                            (ulong)*(byte *)((long)puVar5 + 1) << 0x10 | (ulong)(byte)puVar5[1] << 8
                           );
                  uVar6 = (uint)(byte)puVar5[2];
                  goto LAB_001a633f;
                }
                puVar3 = puVar5;
                if (uVar6 == 7) {
                  stb__lit((byte *)((long)puVar5 + 3),
                           (ushort)(*(ushort *)((long)puVar5 + 1) << 8 |
                                   *(ushort *)((long)puVar5 + 1) >> 8) + 1);
                  puVar3 = (ushort *)
                           ((long)puVar5 +
                           (ulong)(ushort)(*(ushort *)((long)puVar5 + 1) << 8 |
                                          *(ushort *)((long)puVar5 + 1) >> 8) + 4);
                }
              }
            }
            else {
              stb__lit((uchar *)(puVar5 + 1),
                       ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar5 + 1)) - 0x7ff);
              puVar3 = (ushort *)
                       ((long)puVar5 + ((ulong)(ushort)(*puVar5 << 8 | *puVar5 >> 8) - 0x7fd));
            }
          }
          else {
            uVar8 = -(ulong)(((uint)*(byte *)((long)puVar5 + 1) * 0x100 +
                             ((uint)(byte)puVar5[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar6 = (uint)(ushort)(*(ushort *)((long)puVar5 + 3) << 8 |
                                  *(ushort *)((long)puVar5 + 3) >> 8);
LAB_001a633f:
            stb__match(stb__dout + uVar8,uVar6 + 1);
            puVar3 = (ushort *)((long)puVar5 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar5 + 1) * 0x100 +
                              ((uint)(byte)puVar5[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar5 + 3) + 1);
          puVar3 = puVar5 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar5 + 1),uVar6 - 0x7f);
        puVar3 = puVar5 + 1;
      }
      else if (bVar1 < 0x40) {
        stb__lit((byte *)((long)puVar5 + 1),uVar6 - 0x1f);
        puVar3 = (ushort *)((long)puVar5 + ((ulong)(byte)*puVar5 - 0x1e));
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar5 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar5[1] + 1);
        puVar3 = (ushort *)((long)puVar5 + 3);
      }
      if (puVar3 == puVar5) {
        if (((byte)*puVar3 != 5) || (*(byte *)((long)puVar3 + 1) != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0xb47,
                        "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                       );
        }
        if (stb__dout != puVar9) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0xb41,
                        "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                       );
        }
      }
      else if (puVar9 < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0xb4b,
                      "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                     );
      }
      bVar10 = puVar3 != puVar5;
      puVar5 = puVar3;
    } while (bVar10);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_b0.FontData = (void *)0x0;
    local_b0.FontDataSize = 0;
    local_b0.GlyphExtraSpacing.x = 0.0;
    local_b0.GlyphExtraSpacing.y = 0.0;
    local_b0.GlyphOffset.x = 0.0;
    local_b0.GlyphOffset.y = 0.0;
    local_b0.FontDataOwnedByAtlas = true;
    local_b0.FontNo = 0;
    local_b0.SizePixels = 0.0;
    local_b0.OversampleH = 3;
    local_b0.OversampleV = 1;
    local_b0.PixelSnapH = false;
    local_b0.GlyphRanges = (ImWchar *)0x0;
    local_b0.MergeMode = false;
    local_b0.RasterizerFlags = 0;
    local_b0.RasterizerMultiply = 1.0;
    local_b0.Name[0] = '\0';
    local_b0.Name[1] = '\0';
    local_b0.Name[2] = '\0';
    local_b0.Name[3] = '\0';
    local_b0.Name[4] = '\0';
    local_b0.Name[5] = '\0';
    local_b0.Name[6] = '\0';
    local_b0.Name[7] = '\0';
    local_b0.Name[8] = '\0';
    local_b0.Name[9] = '\0';
    local_b0.Name[10] = '\0';
    local_b0.Name[0xb] = '\0';
    local_b0.Name[0xc] = '\0';
    local_b0.Name[0xd] = '\0';
    local_b0.Name[0xe] = '\0';
    local_b0.Name[0xf] = '\0';
    local_b0.Name[0x10] = '\0';
    local_b0.Name[0x11] = '\0';
    local_b0.Name[0x12] = '\0';
    local_b0.Name[0x13] = '\0';
    local_b0.Name[0x14] = '\0';
    local_b0.Name[0x15] = '\0';
    local_b0.Name[0x16] = '\0';
    local_b0.Name[0x17] = '\0';
    local_b0.Name[0x18] = '\0';
    local_b0.Name[0x19] = '\0';
    local_b0.Name[0x1a] = '\0';
    local_b0.Name[0x1b] = '\0';
    local_b0.Name[0x1c] = '\0';
    local_b0.Name[0x1d] = '\0';
    local_b0.Name[0x1e] = '\0';
    local_b0.Name[0x1f] = '\0';
    local_b0.Name[0x20] = '\0';
    local_b0.Name[0x21] = '\0';
    local_b0.Name[0x22] = '\0';
    local_b0.Name[0x23] = '\0';
    local_b0.Name[0x24] = '\0';
    local_b0.Name[0x25] = '\0';
    local_b0.Name[0x26] = '\0';
    local_b0.Name[0x27] = '\0';
    local_b0.DstFont = (ImFont *)0x0;
  }
  else {
    pIVar7 = &local_b0;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      pIVar7->FontData = font_cfg_template->FontData;
      font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar11 * -0x10 + 8);
      pIVar7 = (ImFontConfig *)((long)pIVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    }
  }
  if (local_b0.FontData != (void *)0x0) {
    __assert_fail("font_cfg.FontData == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x63b,
                  "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  local_b0.FontDataOwnedByAtlas = true;
  pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_b0,glyph_ranges);
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}